

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
covenant::CFG::getNullablePositions
          (CFG *this,vector<covenant::Sym,_std::allocator<covenant::Sym>_> *SymVec,
          set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
          *NullableSymbols)

{
  set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *this_00;
  set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *psVar1;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *positions;
  key_type *in_stack_ffffffffffffffa8;
  undefined4 local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x22755f);
  local_28 = 0;
  while( true ) {
    this_00 = (set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *)
              (ulong)local_28;
    psVar1 = (set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *)
             std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(in_RDX);
    if (psVar1 <= this_00) break;
    std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[](in_RDX,(ulong)local_28);
    in_stack_ffffffffffffffa8 =
         (key_type *)
         std::set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>::count
                   (this_00,in_stack_ffffffffffffffa8);
    if (in_stack_ffffffffffffffa8 != (key_type *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                 (value_type_conflict1 *)in_stack_ffffffffffffffa8);
    }
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

vector<unsigned>  
    getNullablePositions(const vector<Sym> &SymVec, 
                         const set<Sym> &NullableSymbols)
    {
      vector<unsigned> positions;
      for (unsigned i=0; i < SymVec.size() ; i++)
      {		
        if (NullableSymbols.count(SymVec[i]) > 0)
          positions.push_back(i);
      }
      return positions;
    }